

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O3

bool __thiscall
HPack::FieldLookupTable::field
          (FieldLookupTable *this,quint32 index,QByteArray *name,QByteArray *value)

{
  pointer pHVar1;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *pvVar2;
  long lVar3;
  ulong uVar4;
  const_reference pvVar5;
  uint uVar6;
  ulong uVar7;
  
  if ((index == 0) ||
     (staticPart(),
     (ulong)this->nDynamic +
     ((long)staticPart::table.
            super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)staticPart::table.
            super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
            super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 < (ulong)index)) {
    return false;
  }
  staticPart();
  uVar7 = (ulong)(index - 1);
  uVar4 = ((long)staticPart::table.
                 super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)staticPart::table.
                 super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl
                 .super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if (uVar4 < uVar7 || uVar4 - uVar7 == 0) {
    uVar6 = ((index - 1) - (int)uVar4) + this->begin;
    pvVar5 = std::
             deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
             ::operator[](&this->chunks,(ulong)(uVar6 >> 4));
    pvVar2 = (pvVar5->_M_t).
             super___uniq_ptr_impl<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
             .
             super__Head_base<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_false>
             ._M_head_impl;
    if (pvVar2 != (vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)0x0) {
      uVar6 = uVar6 & 0xf;
      lVar3 = *(long *)&(pvVar2->
                        super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)
                        ._M_impl;
      uVar4 = ((long)*(pointer *)
                      ((long)&(pvVar2->
                              super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>
                              )._M_impl + 8) - lVar3 >> 4) * -0x5555555555555555;
      if (uVar6 <= uVar4 && uVar4 - uVar6 != 0) {
        QByteArray::operator=(name,(QByteArray *)(lVar3 + (ulong)(uVar6 * 0x30)));
        pHVar1 = (pointer)(lVar3 + (ulong)(uVar6 * 0x30));
        goto LAB_001df656;
      }
      goto LAB_001df679;
    }
  }
  else {
    QByteArray::operator=
              (name,&staticPart::table.
                     super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar7].name);
    uVar4 = ((long)staticPart::table.
                   super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)staticPart::table.
                   super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    if (uVar7 <= uVar4 && uVar4 - uVar7 != 0) {
      pHVar1 = staticPart::table.
               super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
               super__Vector_impl_data._M_start + uVar7;
LAB_001df656:
      QByteArray::operator=(value,&pHVar1->value);
      return true;
    }
    field();
  }
  field();
LAB_001df679:
  field();
}

Assistant:

bool FieldLookupTable::indexIsValid(quint32 index) const
{
    return index && index <= staticPart().size() + nDynamic;
}